

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringhelper.cpp
# Opt level: O2

string * toLower(string *__return_storage_ptr__,string *in)

{
  ulong uVar1;
  string *psVar2;
  int iVar3;
  char *__s;
  ulong uVar4;
  ulong uVar5;
  string *result;
  allocator<char> local_39;
  string *local_38;
  
  uVar1 = in->_M_string_length;
  local_38 = __return_storage_ptr__;
  __s = (char *)operator_new__((long)((uVar1 << 0x20) + 0x100000000) >> 0x20);
  uVar5 = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = uVar1 & 0xffffffff;
  }
  for (; psVar2 = local_38, uVar4 != uVar5; uVar5 = uVar5 + 1) {
    iVar3 = tolower((int)(in->_M_dataplus)._M_p[uVar5]);
    __s[uVar5] = (char)iVar3;
  }
  __s[(long)(uVar1 << 0x20) >> 0x20] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,__s,&local_39);
  operator_delete__(__s);
  return psVar2;
}

Assistant:

std::string toLower(std::string in ) {
     int len = static_cast<int>( in.size() );
     char *buffer = new char[len + 1];
     for( int i = 0; i < len; i++ ) {
        char thischar = in[i];
        thischar = tolower(thischar);
        buffer[i] = thischar;
    }
    buffer[len] = 0;
    std::string result = std::string(buffer);
    delete[] buffer;
    return result;
}